

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O0

JL_STATUS JlGetObjectBool(JlDataObject *BoolObject,_Bool *pBoolValue)

{
  JL_STATUS local_1c;
  JL_STATUS jlStatus;
  _Bool *pBoolValue_local;
  JlDataObject *BoolObject_local;
  
  if ((BoolObject == (JlDataObject *)0x0) || (pBoolValue == (_Bool *)0x0)) {
    local_1c = JL_STATUS_INVALID_PARAMETER;
  }
  else if (BoolObject->Type == JL_DATA_TYPE_BOOL) {
    *pBoolValue = (_Bool)((BoolObject->field_2).Boolean & 1);
    local_1c = JL_STATUS_SUCCESS;
  }
  else {
    *pBoolValue = false;
    local_1c = JL_STATUS_WRONG_TYPE;
  }
  return local_1c;
}

Assistant:

JL_STATUS
    JlGetObjectBool
    (
        JlDataObject const* BoolObject,
        bool*               pBoolValue
    )
{
    JL_STATUS jlStatus;

    if(     NULL != BoolObject
        &&  NULL != pBoolValue )
    {
        if( JL_DATA_TYPE_BOOL == BoolObject->Type )
        {
            *pBoolValue = BoolObject->Boolean;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else
        {
            *pBoolValue = false;
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}